

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  double *pdVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  Limit LVar9;
  int iVar10;
  uint32 uVar11;
  MessageLite *pMVar12;
  string *value_00;
  pair<int,_int> pVar13;
  Extension *pEVar14;
  int64 iVar15;
  LogMessage *other;
  FieldDescriptor *pFVar16;
  FieldType FVar17;
  undefined7 in_register_00000011;
  int value;
  ulong unaff_RBP;
  uint uVar18;
  unsigned_long uVar19;
  uint64 uVar20;
  ulong uVar21;
  LogLevel_conflict LVar22;
  bool bVar23;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar24;
  pair<unsigned_long,_bool> pVar25;
  pair<unsigned_long,_bool> pVar26;
  pair<unsigned_long,_bool> pVar27;
  pair<unsigned_long,_bool> pVar28;
  uint64 value_1;
  LogFinisher local_79;
  double local_78;
  LogMessage local_70;
  ExtensionSet *local_38;
  
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      uVar18 = (uint)*pbVar3;
      if (-1 < (char)*pbVar3) {
        input->buffer_ = pbVar3 + 1;
        bVar23 = true;
        goto LAB_002aff72;
      }
    }
    else {
      uVar18 = 0;
    }
    iVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
    uVar18 = (uint)iVar15;
    bVar23 = -1 < iVar15;
LAB_002aff72:
    if (!bVar23) {
      return false;
    }
    LVar9 = io::CodedInputStream::PushLimit(input,uVar18);
    local_78 = (double)CONCAT44(local_78._4_4_,LVar9);
    switch(extension->type) {
    case '\x01':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar23 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
          }
          else {
            local_70._0_8_ = *pdVar5;
            input->buffer_ = (uint8 *)(pdVar5 + 1);
            bVar23 = true;
          }
          if (bVar23 == false) {
            return false;
          }
          AddDouble(this,number,'\x01',extension->is_packed,(double)local_70._0_8_,
                    extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x02':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar23 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
          }
          else {
            local_70.level_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar23 = true;
          }
          if (bVar23 == false) {
            return false;
          }
          AddFloat(this,number,'\x02',extension->is_packed,(float)local_70.level_,
                   extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x03':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar19 = (unsigned_long)(char)*puVar4, -1 < (long)uVar19)) {
          input->buffer_ = puVar4 + 1;
          pVar25._8_8_ = 1;
          pVar25.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar25 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar19 = pVar25.first;
        }
        if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddInt64(this,number,'\x03',extension->is_packed,uVar19,extension->descriptor);
      }
      break;
    case '\x04':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar20 = (uint64)(char)*puVar4, -1 < (long)uVar20)) {
          input->buffer_ = puVar4 + 1;
          pVar26._8_8_ = 1;
          pVar26.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar20 = pVar26.first;
        }
        if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddUInt64(this,number,'\x04',extension->is_packed,uVar20,extension->descriptor);
      }
      break;
    case '\x05':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar21 = (ulong)bVar1;
          uVar11 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002b0090;
          input->buffer_ = pbVar3 + 1;
          bVar23 = true;
        }
        else {
          uVar11 = 0;
LAB_002b0090:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
          bVar23 = -1 < (long)uVar21;
        }
        if (!bVar23) {
          return false;
        }
        AddInt32(this,number,'\x05',extension->is_packed,(int32)uVar21,extension->descriptor);
      }
      break;
    case '\x06':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar23 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
            if (!bVar23) {
              return false;
            }
          }
          else {
            local_70._0_8_ = *pdVar5;
            input->buffer_ = (uint8 *)(pdVar5 + 1);
          }
          AddUInt64(this,number,'\x06',extension->is_packed,local_70._0_8_,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\a':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar23 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
            if (!bVar23) {
              return false;
            }
          }
          else {
            local_70.level_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
          }
          AddUInt32(this,number,'\a',extension->is_packed,local_70.level_,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\b':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar27._8_8_ = 1;
          pVar27.first = (long)(char)uVar2;
        }
        else {
          pVar27 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddBool(this,number,'\b',extension->is_packed,pVar27.first != 0,extension->descriptor);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x504);
      other = LogMessage::operator<<(&local_70,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_79,other);
      LogMessage::~LogMessage(&local_70);
      break;
    case '\r':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar21 = (ulong)bVar1;
          uVar11 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002b00f7;
          input->buffer_ = pbVar3 + 1;
          bVar23 = true;
        }
        else {
          uVar11 = 0;
LAB_002b00f7:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
          bVar23 = -1 < (long)uVar21;
        }
        if (!bVar23) {
          return false;
        }
        AddUInt32(this,number,'\r',extension->is_packed,(uint32)uVar21,extension->descriptor);
      }
      break;
    case '\x0e':
      local_38 = this;
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar21 = (ulong)bVar1;
          uVar11 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002b04e3;
          input->buffer_ = pbVar3 + 1;
          bVar23 = true;
        }
        else {
          uVar11 = 0;
LAB_002b04e3:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
          bVar23 = -1 < (long)uVar21;
        }
        uVar6 = unaff_RBP;
        if (bVar23) {
          uVar6 = uVar21;
        }
        unaff_RBP = uVar6 & 0xffffffff;
        if (!bVar23) {
          return false;
        }
        bVar8 = (*(extension->field_3).enum_validity_check.func)
                          ((extension->field_3).enum_validity_check.arg,(int)uVar6);
        if (bVar8) {
          AddEnum(local_38,number,'\x0e',extension->is_packed,(int)uVar6,extension->descriptor);
        }
        else {
          (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,uVar6 & 0xffffffff);
        }
        if (!bVar23) {
          return false;
        }
      }
      break;
    case '\x0f':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar23 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
          }
          else {
            local_70.level_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar23 = true;
          }
          if (bVar23 == false) {
            return false;
          }
          AddInt32(this,number,'\x0f',extension->is_packed,local_70.level_,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x10':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar23 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
          }
          else {
            local_70._0_8_ = *pdVar5;
            input->buffer_ = (uint8 *)(pdVar5 + 1);
            bVar23 = true;
          }
          if (bVar23 == false) {
            return false;
          }
          AddInt64(this,number,'\x10',extension->is_packed,local_70._0_8_,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x11':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar21 = (ulong)bVar1;
          uVar11 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002b001a;
          input->buffer_ = pbVar3 + 1;
          bVar23 = true;
        }
        else {
          uVar11 = 0;
LAB_002b001a:
          uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
          bVar23 = -1 < (long)uVar21;
        }
        if (!bVar23) {
          return false;
        }
        AddInt32(this,number,'\x11',extension->is_packed,
                 -((uint)uVar21 & 1) ^ (uint)(uVar21 >> 1) & 0x7fffffff,extension->descriptor);
      }
      break;
    case '\x12':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar21 = (ulong)(char)*puVar4, -1 < (long)uVar21)) {
          input->buffer_ = puVar4 + 1;
          pVar28._8_8_ = 1;
          pVar28.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar28 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar21 = pVar28.first;
        }
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddInt64(this,number,'\x12',extension->is_packed,-(ulong)((uint)uVar21 & 1) ^ uVar21 >> 1,
                 extension->descriptor);
      }
    }
    io::CodedInputStream::PopLimit(input,local_78._0_4_);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar23 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
    }
    else {
      local_70._0_8_ = *pdVar5;
      input->buffer_ = (uint8 *)(pdVar5 + 1);
      bVar23 = true;
    }
    if (bVar23 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,(double)local_70._0_8_,extension->descriptor
               );
    }
    else {
      local_78 = (double)local_70._0_8_;
      pFVar16 = extension->descriptor;
      pVar24 = Insert(this,number);
      pEVar14 = pVar24.first;
      pEVar14->descriptor = pFVar16;
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar14->type = '\x01';
        pEVar14->is_repeated = false;
      }
      pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
      (pEVar14->field_0).double_value = local_78;
    }
    break;
  case '\x02':
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar23 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
    }
    else {
      local_70.level_ = *(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar23 = true;
    }
    if (bVar23 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,(float)local_70.level_,extension->descriptor)
      ;
    }
    else {
      local_78 = (double)CONCAT44(local_78._4_4_,local_70.level_);
      pFVar16 = extension->descriptor;
      pVar24 = Insert(this,number);
      pEVar14 = pVar24.first;
      pEVar14->descriptor = pFVar16;
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar14->type = '\x02';
        pEVar14->is_repeated = false;
      }
      pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
      (pEVar14->field_0).int32_value = local_78._0_4_;
    }
    break;
  case '\x03':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar20 = (uint64)(char)*puVar4, -1 < (long)uVar20)) {
      input->buffer_ = puVar4 + 1;
      uVar18 = 1;
    }
    else {
      pVar28 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar20 = pVar28.first;
      uVar18 = pVar28._8_4_;
    }
    if ((uVar18 & 1) == 0) {
      return false;
    }
    if (extension->is_repeated == true) {
      bVar23 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x03';
LAB_002afd3b:
      AddInt64(this,number,FVar17,bVar23,uVar20,pFVar16);
      goto LAB_002afef4;
    }
    pFVar16 = extension->descriptor;
    pVar24 = Insert(this,number);
    pEVar14 = pVar24.first;
    pEVar14->descriptor = pFVar16;
    if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar14->type = '\x03';
      pEVar14->is_repeated = false;
    }
    goto LAB_002afeed;
  case '\x04':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar20 = (uint64)(char)*puVar4, -1 < (long)uVar20)) {
      input->buffer_ = puVar4 + 1;
      uVar18 = 1;
    }
    else {
      pVar28 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar20 = pVar28.first;
      uVar18 = pVar28._8_4_;
    }
    if ((uVar18 & 1) == 0) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddUInt64(this,number,'\x04',extension->is_packed,uVar20,extension->descriptor);
      goto LAB_002afef4;
    }
    pFVar16 = extension->descriptor;
    pVar24 = Insert(this,number);
    pEVar14 = pVar24.first;
    pEVar14->descriptor = pFVar16;
    if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar14->type = '\x04';
      pEVar14->is_repeated = false;
    }
    goto LAB_002afeed;
  case '\x05':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar21 = (ulong)bVar1;
      uVar11 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002b06dd;
      input->buffer_ = pbVar3 + 1;
      bVar23 = true;
    }
    else {
      uVar11 = 0;
LAB_002b06dd:
      uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
      bVar23 = -1 < (long)uVar21;
    }
    uVar11 = (uint32)uVar21;
    if (!bVar23) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddInt32(this,number,'\x05',extension->is_packed,uVar11,extension->descriptor);
      goto LAB_002b07b0;
    }
    pFVar16 = extension->descriptor;
    pVar24 = Insert(this,number);
    pEVar14 = pVar24.first;
    pEVar14->descriptor = pFVar16;
    if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar14->type = '\x05';
      pEVar14->is_repeated = false;
    }
    goto LAB_002b07a9;
  case '\x06':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar23 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
    }
    else {
      local_70._0_8_ = *pdVar5;
      input->buffer_ = (uint8 *)(pdVar5 + 1);
      bVar23 = true;
    }
    uVar7 = local_70._0_8_;
    if (bVar23 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddUInt64(this,number,'\x06',extension->is_packed,local_70._0_8_,extension->descriptor);
    }
    else {
      pFVar16 = extension->descriptor;
      pVar24 = Insert(this,number);
      pEVar14 = pVar24.first;
      pEVar14->descriptor = pFVar16;
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar14->type = '\x06';
        pEVar14->is_repeated = false;
      }
      pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
      (pEVar14->field_0).uint64_value = uVar7;
    }
    break;
  case '\a':
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar23 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
    }
    else {
      local_70.level_ = *(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar23 = true;
    }
    if (bVar23 == false) {
      return false;
    }
    LVar22 = local_70.level_;
    if (extension->is_repeated == true) {
      AddUInt32(this,number,'\a',extension->is_packed,local_70.level_,extension->descriptor);
    }
    else {
      pFVar16 = extension->descriptor;
      pVar24 = Insert(this,number);
      pEVar14 = pVar24.first;
      pEVar14->descriptor = pFVar16;
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar14->type = '\a';
        pEVar14->is_repeated = false;
      }
      pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
      (pEVar14->field_0).uint32_value = LVar22;
    }
    break;
  case '\b':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar19 = (unsigned_long)(char)*puVar4, -1 < (long)uVar19))
    {
      input->buffer_ = puVar4 + 1;
      uVar18 = 1;
    }
    else {
      pVar28 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar19 = pVar28.first;
      uVar18 = pVar28._8_4_;
    }
    if ((uVar18 & 1) == 0) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,uVar19 != 0,extension->descriptor);
    }
    else {
      pFVar16 = extension->descriptor;
      pVar24 = Insert(this,number);
      pEVar14 = pVar24.first;
      pEVar14->descriptor = pFVar16;
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar14->type = '\b';
        pEVar14->is_repeated = false;
      }
      pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
      (pEVar14->field_0).bool_value = uVar19 != 0;
    }
    goto LAB_002afef4;
  case '\t':
    pFVar16 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar17 = '\t';
      goto LAB_002afc11;
    }
    FVar17 = '\t';
LAB_002afb61:
    value_00 = AddString_abi_cxx11_(this,number,FVar17,pFVar16);
    goto LAB_002afc16;
  case '\n':
    pMVar12 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar12 = AddMessage(this,number,'\n',pMVar12,extension->descriptor);
    }
    else {
      pMVar12 = MutableMessage(this,number,'\n',pMVar12,extension->descriptor);
    }
    iVar10 = input->recursion_budget_;
    input->recursion_budget_ = iVar10 + -1;
    if (iVar10 < 1) {
      return false;
    }
    bVar23 = MessageLite::MergePartialFromCodedStream(pMVar12,input);
    if (!bVar23) {
      return false;
    }
    input->recursion_budget_ = input->recursion_budget_ + 1;
    if (input->last_tag_ == number * 8 + 4U) {
      return true;
    }
    return false;
  case '\v':
    pMVar12 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar12 = AddMessage(this,number,'\v',pMVar12,extension->descriptor);
    }
    else {
      pMVar12 = MutableMessage(this,number,'\v',pMVar12,extension->descriptor);
    }
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (iVar10 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
      input->buffer_ = puVar4 + 1;
      bVar23 = true;
    }
    else {
      iVar10 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      bVar23 = -1 < iVar10;
    }
    if (!bVar23) {
      return false;
    }
    pVar13 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar10);
    if ((long)pVar13 < 0) {
      return false;
    }
    bVar23 = MessageLite::MergePartialFromCodedStream(pMVar12,input);
    if (!bVar23) {
      return false;
    }
    bVar23 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar13.first);
    break;
  case '\f':
    pFVar16 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar17 = '\f';
      goto LAB_002afb61;
    }
    FVar17 = '\f';
LAB_002afc11:
    value_00 = MutableString_abi_cxx11_(this,number,FVar17,pFVar16);
LAB_002afc16:
    bVar23 = WireFormatLite::ReadBytes(input,value_00);
    break;
  case '\r':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar21 = (ulong)bVar1;
      uVar11 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002b074a;
      input->buffer_ = pbVar3 + 1;
      bVar23 = true;
    }
    else {
      uVar11 = 0;
LAB_002b074a:
      uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
      bVar23 = -1 < (long)uVar21;
    }
    uVar11 = (uint32)uVar21;
    if (!bVar23) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddUInt32(this,number,'\r',extension->is_packed,uVar11,extension->descriptor);
      goto LAB_002b07b0;
    }
    pFVar16 = extension->descriptor;
    pVar24 = Insert(this,number);
    pEVar14 = pVar24.first;
    pEVar14->descriptor = pFVar16;
    if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar14->type = '\r';
      pEVar14->is_repeated = false;
    }
LAB_002b07a9:
    pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
    (pEVar14->field_0).uint32_value = uVar11;
LAB_002b07b0:
    if (!bVar23) {
      return false;
    }
    return true;
  case '\x0e':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      uVar18 = (uint)*pbVar3;
      if (-1 < (char)*pbVar3) {
        input->buffer_ = pbVar3 + 1;
        bVar23 = true;
        goto LAB_002b0823;
      }
    }
    else {
      uVar18 = 0;
    }
    iVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
    uVar18 = (uint)iVar15;
    bVar23 = -1 < iVar15;
LAB_002b0823:
    if (!bVar23) {
      return false;
    }
    bVar8 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,uVar18);
    if (bVar8) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,uVar18,extension->descriptor);
      }
      else {
        pFVar16 = extension->descriptor;
        pVar24 = Insert(this,number);
        pEVar14 = pVar24.first;
        pEVar14->descriptor = pFVar16;
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pEVar14->type = '\x0e';
          pEVar14->is_repeated = false;
        }
        pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
        (pEVar14->field_0).enum_value = uVar18;
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)uVar18);
    }
    if (!bVar23) {
      return false;
    }
    return true;
  case '\x0f':
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar23 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_70.level_);
    }
    else {
      local_70.level_ = *(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar23 = true;
    }
    if (bVar23 == false) {
      return false;
    }
    LVar22 = local_70.level_;
    if (extension->is_repeated == true) {
      bVar8 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x0f';
LAB_002b0686:
      AddInt32(this,number,FVar17,bVar8,LVar22,pFVar16);
    }
    else {
      pFVar16 = extension->descriptor;
      pVar24 = Insert(this,number);
      pEVar14 = pVar24.first;
      pEVar14->descriptor = pFVar16;
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar14->type = '\x0f';
        pEVar14->is_repeated = false;
      }
      pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
      (pEVar14->field_0).int32_value = LVar22;
    }
    break;
  case '\x10':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar23 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_70);
    }
    else {
      local_70._0_8_ = *pdVar5;
      input->buffer_ = (uint8 *)(pdVar5 + 1);
      bVar23 = true;
    }
    uVar7 = local_70._0_8_;
    if (bVar23 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddInt64(this,number,'\x10',extension->is_packed,local_70._0_8_,extension->descriptor);
    }
    else {
      pFVar16 = extension->descriptor;
      pVar24 = Insert(this,number);
      pEVar14 = pVar24.first;
      pEVar14->descriptor = pFVar16;
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar14->type = '\x10';
        pEVar14->is_repeated = false;
      }
      pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
      (pEVar14->field_0).int64_value = uVar7;
    }
    break;
  case '\x11':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar21 = (ulong)bVar1;
      uVar11 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002b063c;
      input->buffer_ = pbVar3 + 1;
      bVar23 = true;
    }
    else {
      uVar11 = 0;
LAB_002b063c:
      uVar21 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
      bVar23 = -1 < (long)uVar21;
    }
    if (bVar23 == false) {
      return false;
    }
    LVar22 = -((uint)uVar21 & 1) ^ (LogLevel_conflict)(uVar21 >> 1) & 0x7fffffff;
    if (extension->is_repeated == true) {
      bVar8 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x11';
      goto LAB_002b0686;
    }
    pFVar16 = extension->descriptor;
    pVar24 = Insert(this,number);
    pEVar14 = pVar24.first;
    pEVar14->descriptor = pFVar16;
    if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar14->type = '\x11';
      pEVar14->is_repeated = false;
    }
    pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
    (pEVar14->field_0).int32_value = LVar22;
    break;
  case '\x12':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar21 = (ulong)(char)*puVar4, -1 < (long)uVar21)) {
      input->buffer_ = puVar4 + 1;
      uVar18 = 1;
    }
    else {
      pVar28 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar21 = pVar28.first;
      uVar18 = pVar28._8_4_;
    }
    if ((uVar18 & 1) == 0) {
      return false;
    }
    uVar20 = -(ulong)((uint)uVar21 & 1) ^ uVar21 >> 1;
    if (extension->is_repeated == true) {
      bVar23 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar17 = '\x12';
      goto LAB_002afd3b;
    }
    pFVar16 = extension->descriptor;
    pVar24 = Insert(this,number);
    pEVar14 = pVar24.first;
    pEVar14->descriptor = pFVar16;
    if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar14->type = '\x12';
      pEVar14->is_repeated = false;
    }
LAB_002afeed:
    pEVar14->field_0xa = pEVar14->field_0xa & 0xf0;
    (pEVar14->field_0).int64_value = uVar20;
LAB_002afef4:
    if ((uVar18 & 1) == 0) {
      return false;
    }
    return true;
  default:
    goto LAB_002b0899;
  }
  if (bVar23 == false) {
    return false;
  }
LAB_002b0899:
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(int number,
                                               bool was_packed_on_wire,
                                               const ExtensionInfo& extension,
                                               io::CodedInputStream* input,
                                               FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    while (input->BytesUntilLimit() > 0) {                                  \
      CPP_LOWERCASE value;                                                  \
      if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                     \
                                         WireFormatLite::TYPE_##UPPERCASE>( \
              input, &value))                                               \
        return false;                                                       \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    }                                                                       \
    break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    CPP_LOWERCASE value;                                                    \
    if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                       \
                                       WireFormatLite::TYPE_##UPPERCASE>(   \
            input, &value))                                                 \
      return false;                                                         \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_BYTES,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_BYTES,
                                extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}